

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_NodeAddToClass(Ivy_Obj_t *pClass,Ivy_Obj_t *pObj)

{
  Ivy_Obj_t **ppIVar1;
  
  if (pClass->pNextFan1 == (Ivy_Obj_t *)0x0) {
    ppIVar1 = &pClass->pNextFan1;
  }
  else {
    ppIVar1 = &pClass->pNextFan0->pNextFan1;
  }
  *ppIVar1 = pObj;
  pClass->pNextFan0 = pObj;
  pObj->pNextFan0 = pClass;
  pObj->pNextFan1 = (Ivy_Obj_t *)0x0;
  return;
}

Assistant:

void Ivy_NodeAddToClass( Ivy_Obj_t * pClass, Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_ObjSetClassNodeNext( pClass, pObj );
    else
        Ivy_ObjSetClassNodeNext( Ivy_ObjClassNodeLast(pClass), pObj );
    Ivy_ObjSetClassNodeLast( pClass, pObj );
    Ivy_ObjSetClassNodeRepr( pObj, pClass );
    Ivy_ObjSetClassNodeNext( pObj, NULL );
}